

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  wchar_t wVar1;
  long lVar2;
  size_t sVar3;
  char *buffer;
  FILE *pFVar4;
  long lVar5;
  size_t size;
  char mode_ascii [4];
  char local_2c [4];
  
  if (path == (wchar_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                  ,0x137d,
                  "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
  }
  lVar2 = -4;
  do {
    lVar5 = lVar2 + 4;
    lVar2 = lVar2 + 4;
  } while (*(int *)((long)path + lVar5) != 0);
  if (lVar2 == 0) {
    size = 0;
  }
  else {
    sVar3 = 0;
    size = 0;
    do {
      wVar1 = path[sVar3];
      lVar5 = 4;
      if (((uint)wVar1 < 0x10000) && (lVar5 = 1, 0x7f < (uint)wVar1)) {
        lVar5 = 3 - (ulong)((uint)wVar1 < 0x800);
      }
      size = size + lVar5;
      sVar3 = sVar3 + 1;
    } while (lVar2 >> 2 != sVar3);
  }
  buffer = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(size + 1);
  if (buffer == (char *)0x0) {
    buffer = (char *)0x0;
  }
  else {
    as_utf8_end(buffer,size,path,lVar2 >> 2);
    buffer[size] = '\0';
  }
  if (buffer == (char *)0x0) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    local_2c[0] = '\0';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    wVar1 = *mode;
    if (wVar1 != L'\0') {
      lVar2 = 0;
      do {
        local_2c[lVar2] = (char)wVar1;
        wVar1 = mode[lVar2 + 1];
        lVar2 = lVar2 + 1;
      } while (wVar1 != L'\0');
    }
    pFVar4 = fopen(buffer,local_2c);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (buffer);
  }
  return (FILE *)pFVar4;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}